

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O0

void __thiscall DrawerCommandQueue::~DrawerCommandQueue(DrawerCommandQueue *this)

{
  DrawerCommandQueue *this_local;
  
  StopThreads(this);
  DrawerThread::~DrawerThread(&this->single_core_thread);
  FString::~FString(&this->thread_error);
  std::condition_variable::~condition_variable(&this->end_condition);
  std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::~vector(&this->active_commands);
  std::condition_variable::~condition_variable(&this->start_condition);
  std::vector<DrawerThread,_std::allocator<DrawerThread>_>::~vector(&this->threads);
  std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::~vector(&this->commands);
  return;
}

Assistant:

DrawerCommandQueue::~DrawerCommandQueue()
{
	StopThreads();
}